

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_unmark_geom_support(REF_SUBDIV ref_subdiv)

{
  uint uVar1;
  uint local_38;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_INT nmark;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL needs_support;
  REF_INT edge;
  REF_EDGE ref_edge;
  REF_SUBDIV ref_subdiv_local;
  
  _needs_support = ref_subdiv->edge;
  ref_edge = (REF_EDGE)ref_subdiv;
  ref_private_macro_code_rss_2 =
       ref_edge_ghost_int(ref_subdiv->edge,ref_subdiv->grid->mpi,ref_subdiv->mark);
  if (ref_private_macro_code_rss_2 == 0) {
    ref_private_macro_code_rss_2 = 0;
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < _needs_support->n;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if ((&ref_edge->adj->nnode)[ref_private_macro_code_rss] != 0) {
        nmark = ref_geom_support_between
                          (*(REF_GRID *)ref_edge,
                           _needs_support->e2n[ref_private_macro_code_rss << 1],
                           _needs_support->e2n[ref_private_macro_code_rss * 2 + 1],
                           &ref_private_macro_code_rss_1);
        if (nmark != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x368,"ref_subdiv_unmark_geom_support",(ulong)(uint)nmark,"support check");
          return nmark;
        }
        if (ref_private_macro_code_rss_1 != 0) {
          (&ref_edge->adj->nnode)[ref_private_macro_code_rss] = 0;
        }
        nmark = 0;
      }
    }
    ref_private_macro_code_rss_3 =
         ref_edge_ghost_int((REF_EDGE)ref_edge->e2n,(REF_MPI)**(undefined8 **)ref_edge,
                            &ref_edge->adj->nnode);
    if (ref_private_macro_code_rss_3 == 0) {
      if (*(int *)&ref_edge[1].e2n != 0) {
        uVar1 = ref_subdiv_mark_n((REF_SUBDIV)ref_edge,(REF_INT *)&local_38);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x374,"ref_subdiv_unmark_geom_support",(ulong)uVar1,"count");
          return uVar1;
        }
        if (*(int *)(**(long **)ref_edge + 4) == 0) {
          printf(" %d edges marked without geom support\n",(ulong)local_38);
        }
      }
      ref_subdiv_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x370,"ref_subdiv_unmark_geom_support",(ulong)(uint)ref_private_macro_code_rss_3,
             "ghost mark");
      ref_subdiv_local._4_4_ = ref_private_macro_code_rss_3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x361,
           "ref_subdiv_unmark_geom_support",(ulong)(uint)ref_private_macro_code_rss_2,"ghost mark");
    ref_subdiv_local._4_4_ = ref_private_macro_code_rss_2;
  }
  return ref_subdiv_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_unmark_geom_support(
    REF_SUBDIV ref_subdiv) {
  REF_EDGE ref_edge = ref_subdiv_edge(ref_subdiv);
  REF_INT edge;
  REF_BOOL needs_support;

  RSS(ref_edge_ghost_int(ref_subdiv_edge(ref_subdiv),
                         ref_subdiv_mpi(ref_subdiv), ref_subdiv->mark),
      "ghost mark");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    if (ref_subdiv_mark(ref_subdiv, edge)) {
      RSS(ref_geom_support_between(
              ref_subdiv_grid(ref_subdiv), ref_edge_e2n(ref_edge, 0, edge),
              ref_edge_e2n(ref_edge, 1, edge), &needs_support),
          "support check");
      if (needs_support) ref_subdiv_mark(ref_subdiv, edge) = 0;
    }
  }

  /* not be required but here for safety? */
  RSS(ref_edge_ghost_int(ref_subdiv_edge(ref_subdiv),
                         ref_subdiv_mpi(ref_subdiv), ref_subdiv->mark),
      "ghost mark");

  if (ref_subdiv->instrument) {
    REF_INT nmark;
    RSS(ref_subdiv_mark_n(ref_subdiv, &nmark), "count");
    if (ref_mpi_once(ref_subdiv_mpi(ref_subdiv)))
      printf(" %d edges marked without geom support\n", nmark);
  }

  return REF_SUCCESS;
}